

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall
QLayout::replaceWidget(QLayout *this,QWidget *from,QWidget *to,FindChildOptions options)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  QWidget *pQVar4;
  long lVar5;
  QLayoutItem *pQVar6;
  QLayoutItem *pQVar7;
  int u;
  int iVar8;
  
  if (((from != to) && (from != (QWidget *)0x0)) && (to != (QWidget *)0x0)) {
    plVar1 = *(long **)&this->field_0x8;
    for (iVar8 = 0; iVar2 = (**(code **)(*(long *)this + 200))(this), iVar8 < iVar2;
        iVar8 = iVar8 + 1) {
      plVar3 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar8);
      if (plVar3 != (long *)0x0) {
        pQVar4 = (QWidget *)(**(code **)(*plVar3 + 0x68))(plVar3);
        if (pQVar4 == from) {
          addChildWidget(this,to);
          pQVar6 = (QLayoutItem *)operator_new(0x18);
          (pQVar6->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
          pQVar6->_vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007c0d88;
          pQVar6[1]._vptr_QLayoutItem = (_func_int **)to;
          QLayoutItem::setAlignment
                    (pQVar6,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                            ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(plVar3 + 1))->
                            super_QFlagsStorage<Qt::AlignmentFlag>);
          pQVar7 = (QLayoutItem *)(**(code **)(*plVar1 + 0x20))(plVar1,iVar8,pQVar6);
          if (pQVar7 == (QLayoutItem *)0x0) {
            (*pQVar6->_vptr_QLayoutItem[1])(pQVar6);
            return (QLayoutItem *)0x0;
          }
          return pQVar7;
        }
        lVar5 = (**(code **)(*plVar3 + 0x70))(plVar3);
        if (lVar5 != 0 &&
            ((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                   super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
          plVar3 = (long *)(**(code **)(*plVar3 + 0x70))(plVar3);
          pQVar6 = (QLayoutItem *)
                   (**(code **)(*plVar3 + 0xe0))
                             (plVar3,from,to,
                              options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                              super_QFlagsStorage<Qt::FindChildOption>.i);
          if (pQVar6 != (QLayoutItem *)0x0) {
            return pQVar6;
          }
        }
      }
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QLayout::replaceWidget(QWidget *from, QWidget *to, Qt::FindChildOptions options)
{
    Q_D(QLayout);
    if (!from || !to)
        return nullptr;
    if (from == to)     // Do not return a QLayoutItem for \a from, since ownership still
        return nullptr; // belongs to the layout (since nothing was changed)

    int index = -1;
    QLayoutItem *item = nullptr;
    for (int u = 0; u < count(); ++u) {
        item = itemAt(u);
        if (!item)
            continue;

        if (item->widget() == from) {
            index = u;
            break;
        }

        if (item->layout() && (options & Qt::FindChildrenRecursively)) {
            QLayoutItem *r = item->layout()->replaceWidget(from, to, options);
            if (r)
                return r;
        }
    }
    if (index == -1)
        return nullptr;

    addChildWidget(to);
    QLayoutItem *newitem = new QWidgetItem(to);
    newitem->setAlignment(item->alignment());
    QLayoutItem *r = d->replaceAt(index, newitem);
    if (!r)
        delete newitem;
    return r;
}